

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void DC16Mode_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  long in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_stack_00000018;
  uint8_t *in_stack_00000020;
  
  if (in_RDX == 0) {
    if (in_RSI == (uint8_t *)0x0) {
      DC16NoTopLeft_SSE2((uint8_t *)0x168979);
    }
    else {
      DC16NoTop_SSE2(in_RSI,(uint8_t *)0x0);
    }
  }
  else if (in_RSI == (uint8_t *)0x0) {
    DC16NoLeft_SSE2(left,top);
  }
  else {
    DC16_SSE2(in_stack_00000020,in_stack_00000018,dst);
  }
  return;
}

Assistant:

static WEBP_INLINE void DC16Mode_SSE2(uint8_t* WEBP_RESTRICT dst,
                                      const uint8_t* WEBP_RESTRICT left,
                                      const uint8_t* WEBP_RESTRICT top) {
  if (top != NULL) {
    if (left != NULL) {  // top and left present
      DC16_SSE2(dst, left, top);
    } else {  // top, but no left
      DC16NoLeft_SSE2(dst, top);
    }
  } else if (left != NULL) {  // left but no top
    DC16NoTop_SSE2(dst, left);
  } else {  // no top, no left, nothing.
    DC16NoTopLeft_SSE2(dst);
  }
}